

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

void DecideOverLiteralContextModeling
               (uint8_t *input,size_t start_pos,size_t length,size_t mask,int quality,
               ContextType *literal_context_mode,size_t *num_literal_contexts,
               uint32_t **literal_context_map)

{
  int *piVar1;
  undefined1 auVar2 [16];
  int iVar3;
  uint uVar4;
  size_t stride_end_pos;
  ulong uVar5;
  uint *puVar6;
  uint *puVar7;
  undefined1 *puVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined4 uVar22;
  undefined4 uVar23;
  uint32_t monogram_histo [3];
  uint32_t bigram_prefix_histo [9];
  double local_e0;
  uint local_d8 [4];
  undefined1 local_c8 [16];
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  uint auStack_90 [2];
  undefined1 local_88 [16];
  uint local_78 [8];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  if (0x3f < length && 4 < quality) {
    auStack_90[1] = quality;
    uVar9 = length + start_pos;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_38 = 0;
    for (uVar5 = start_pos + 0x40; uVar5 <= uVar9; uVar5 = uVar5 + 0x1000) {
      if (start_pos + 1 < uVar5) {
        iVar10 = DecideOverLiteralContextModeling::lut[input[start_pos & mask] >> 6];
        lVar14 = 1;
        do {
          iVar3 = iVar10 * 3;
          iVar10 = DecideOverLiteralContextModeling::lut[input[start_pos + lVar14 & mask] >> 6];
          piVar1 = (int *)((long)&local_58 + (long)(iVar3 + iVar10) * 4);
          *piVar1 = *piVar1 + 1;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 0x40);
      }
      start_pos = start_pos + 0x1000;
    }
    puVar7 = local_d8 + 1;
    *literal_context_mode = CONTEXT_UTF8;
    uVar5 = 0;
    local_d8[0] = 0;
    local_d8[1] = 0;
    local_d8[2] = 0;
    local_78[4] = 0;
    local_78[5] = 0;
    local_78[0] = 0;
    local_78[1] = 0;
    local_78[2] = 0;
    local_78[3] = 0;
    do {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar5;
      iVar10 = *(int *)((long)&local_58 + uVar5 * 4);
      piVar1 = (int *)((long)local_d8 +
                      uVar5 * 4 +
                      (SUB168(auVar2 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffcU) *
                      -3);
      *piVar1 = *piVar1 + iVar10;
      uVar9 = uVar5;
      if (5 < uVar5) {
        uVar9 = uVar5 - 6;
      }
      local_78[uVar9] = local_78[uVar9] + iVar10;
      uVar5 = uVar5 + 1;
    } while (uVar5 != 9);
    bVar13 = true;
    puVar6 = local_d8;
    dVar17 = 0.0;
    uVar22 = 0;
    uVar23 = 0;
    lVar14 = 0;
    while( true ) {
      uVar5 = (ulong)*puVar6;
      if (uVar5 < 0x100) {
        dVar15 = (double)kLog2Table[uVar5];
      }
      else {
        local_c8._8_4_ = uVar22;
        local_c8._0_8_ = dVar17;
        local_c8._12_4_ = uVar23;
        dVar15 = log2((double)uVar5);
        dVar17 = local_c8._0_8_;
        uVar22 = local_c8._8_4_;
        uVar23 = local_c8._12_4_;
      }
      uVar9 = lVar14 + uVar5;
      dVar17 = dVar17 - (double)uVar5 * dVar15;
      if (!bVar13) break;
      uVar5 = (ulong)*puVar7;
      if (uVar5 < 0x100) {
        dVar15 = (double)kLog2Table[uVar5];
      }
      else {
        local_c8._8_4_ = uVar22;
        local_c8._0_8_ = dVar17;
        local_c8._12_4_ = uVar23;
        dVar15 = log2((double)uVar5);
        dVar17 = local_c8._0_8_;
        uVar22 = local_c8._8_4_;
        uVar23 = local_c8._12_4_;
      }
      lVar14 = uVar9 + uVar5;
      dVar17 = dVar17 - (double)uVar5 * dVar15;
      bVar13 = false;
      puVar6 = local_d8 + 2;
      puVar7 = local_d8 + 3;
    }
    if (uVar9 != 0) {
      auVar18._8_4_ = (int)(uVar9 >> 0x20);
      auVar18._0_8_ = uVar9;
      auVar18._12_4_ = 0x45300000;
      dVar15 = (auVar18._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0);
      if (uVar9 < 0x100) {
        dVar16 = (double)kLog2Table[uVar9];
      }
      else {
        local_c8._8_4_ = uVar22;
        local_c8._0_8_ = dVar17;
        local_c8._12_4_ = uVar23;
        dVar16 = log2(dVar15);
        dVar17 = local_c8._0_8_;
        uVar22 = local_c8._8_4_;
        uVar23 = local_c8._12_4_;
      }
      dVar17 = dVar17 + dVar15 * dVar16;
    }
    local_c8._8_4_ = uVar22;
    local_c8._0_8_ = dVar17;
    local_c8._12_4_ = uVar23;
    bVar13 = true;
    local_a8 = 0.0;
    uStack_a0 = 0;
    lVar14 = 0;
    puVar7 = local_78;
    puVar6 = local_78 + 1;
    while( true ) {
      uVar5 = (ulong)*puVar7;
      if (uVar5 < 0x100) {
        dVar17 = (double)kLog2Table[uVar5];
      }
      else {
        dVar17 = log2((double)uVar5);
      }
      uVar9 = lVar14 + uVar5;
      local_a8 = local_a8 - (double)uVar5 * dVar17;
      if (!bVar13) break;
      uVar5 = (ulong)*puVar6;
      if (uVar5 < 0x100) {
        dVar17 = (double)kLog2Table[uVar5];
      }
      else {
        dVar17 = log2((double)uVar5);
      }
      lVar14 = uVar9 + uVar5;
      local_a8 = local_a8 - (double)uVar5 * dVar17;
      bVar13 = false;
      puVar7 = local_78 + 2;
      puVar6 = local_78 + 3;
    }
    if (uVar9 != 0) {
      auVar19._8_4_ = (int)(uVar9 >> 0x20);
      auVar19._0_8_ = uVar9;
      auVar19._12_4_ = 0x45300000;
      dVar17 = (auVar19._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0);
      if (uVar9 < 0x100) {
        dVar15 = (double)kLog2Table[uVar9];
      }
      else {
        dVar15 = log2(dVar17);
      }
      local_a8 = local_a8 + dVar17 * dVar15;
    }
    uVar5 = 0xc;
    local_b8 = 0.0;
    uStack_b0 = 0;
    lVar14 = 0;
    while( true ) {
      uVar9 = (ulong)*(uint *)((long)local_78 + uVar5);
      if (uVar9 < 0x100) {
        dVar17 = (double)kLog2Table[uVar9];
      }
      else {
        dVar17 = log2((double)uVar9);
      }
      uVar11 = lVar14 + uVar9;
      local_b8 = local_b8 - (double)uVar9 * dVar17;
      if (0x13 < uVar5) break;
      uVar9 = (ulong)*(uint *)((long)local_78 + uVar5 + 4);
      if (uVar9 < 0x100) {
        dVar17 = (double)kLog2Table[uVar9];
      }
      else {
        dVar17 = log2((double)uVar9);
      }
      lVar14 = uVar11 + uVar9;
      local_b8 = local_b8 - (double)uVar9 * dVar17;
      uVar5 = uVar5 + 8;
    }
    if (uVar11 != 0) {
      auVar20._8_4_ = (int)(uVar11 >> 0x20);
      auVar20._0_8_ = uVar11;
      auVar20._12_4_ = 0x45300000;
      dVar17 = (auVar20._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0);
      if (uVar11 < 0x100) {
        dVar15 = (double)kLog2Table[uVar11];
      }
      else {
        dVar15 = log2(dVar17);
      }
      local_b8 = local_b8 + dVar17 * dVar15;
    }
    local_e0 = 0.0;
    lVar14 = 0;
    do {
      bVar13 = true;
      lVar12 = 0;
      dVar17 = 0.0;
      uVar5 = 0;
      while( true ) {
        uVar9 = (ulong)*(uint *)((long)&local_58 + uVar5 + lVar14 * 0xc);
        dVar15 = (double)uVar9;
        if (uVar9 < 0x100) {
          dVar16 = (double)kLog2Table[uVar9];
        }
        else {
          local_88._0_8_ = dVar15;
          dVar16 = log2(dVar15);
          dVar15 = (double)local_88._0_8_;
        }
        uVar9 = lVar12 + uVar9;
        dVar17 = dVar17 - dVar15 * dVar16;
        if (!bVar13) break;
        uVar5 = (ulong)*(uint *)((long)&local_58 + (uVar5 | 4) + lVar14 * 0xc);
        dVar15 = (double)uVar5;
        if (uVar5 < 0x100) {
          dVar16 = (double)kLog2Table[uVar5];
        }
        else {
          local_88._0_8_ = dVar15;
          dVar16 = log2(dVar15);
          dVar15 = (double)local_88._0_8_;
        }
        lVar12 = uVar9 + uVar5;
        dVar17 = dVar17 - dVar15 * dVar16;
        uVar5 = 8;
        bVar13 = false;
      }
      if (uVar9 != 0) {
        auVar21._8_4_ = (int)(uVar9 >> 0x20);
        auVar21._0_8_ = uVar9;
        auVar21._12_4_ = 0x45300000;
        dVar16 = auVar21._8_8_ - 1.9342813113834067e+25;
        dVar15 = dVar16 + ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0);
        if (uVar9 < 0x100) {
          dVar16 = (double)kLog2Table[uVar9];
        }
        else {
          local_88._8_4_ = SUB84(dVar16,0);
          local_88._0_8_ = dVar15;
          local_88._12_4_ = (int)((ulong)dVar16 >> 0x20);
          dVar16 = log2(dVar15);
          dVar15 = (double)local_88._0_8_;
        }
        dVar17 = dVar17 + dVar15 * dVar16;
      }
      local_e0 = local_e0 + dVar17;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    uVar4 = local_d8[1] + local_d8[0] + local_d8[2];
    if (uVar4 == 0) {
      __assert_fail("total != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/encode.c"
                    ,0x168,"void ChooseContextMap(int, uint32_t *, size_t *, const uint32_t **)");
    }
    dVar15 = 1.0 / (double)uVar4;
    dVar17 = (double)local_c8._0_8_ * dVar15;
    dVar16 = (local_a8 + local_b8) * dVar15;
    if ((int)auStack_90[1] < 7) {
      local_e0 = dVar17 * 10.0;
    }
    else {
      local_e0 = local_e0 * dVar15;
    }
    if ((0.2 <= dVar17 - dVar16) || (0.2 <= dVar17 - local_e0)) {
      if (0.02 <= dVar16 - local_e0) {
        *num_literal_contexts = 3;
        puVar8 = ChooseContextMap_kStaticContextMapContinuation;
      }
      else {
        *num_literal_contexts = 2;
        puVar8 = ChooseContextMap_kStaticContextMapSimpleUTF8;
      }
      *literal_context_map = (uint32_t *)puVar8;
    }
    else {
      *num_literal_contexts = 1;
    }
  }
  return;
}

Assistant:

static void DecideOverLiteralContextModeling(const uint8_t* input,
    size_t start_pos, size_t length, size_t mask, int quality,
    ContextType* literal_context_mode, size_t* num_literal_contexts,
    const uint32_t** literal_context_map) {
  if (quality < MIN_QUALITY_FOR_CONTEXT_MODELING || length < 64) {
    return;
  } else {
    /* Gather bi-gram data of the UTF8 byte prefixes. To make the analysis of
       UTF8 data faster we only examine 64 byte long strides at every 4kB
       intervals. */
    const size_t end_pos = start_pos + length;
    uint32_t bigram_prefix_histo[9] = { 0 };
    for (; start_pos + 64 <= end_pos; start_pos += 4096) {
      static const int lut[4] = { 0, 0, 1, 2 };
      const size_t stride_end_pos = start_pos + 64;
      int prev = lut[input[start_pos & mask] >> 6] * 3;
      size_t pos;
      for (pos = start_pos + 1; pos < stride_end_pos; ++pos) {
        const uint8_t literal = input[pos & mask];
        ++bigram_prefix_histo[prev + lut[literal >> 6]];
        prev = lut[literal >> 6] * 3;
      }
    }
    *literal_context_mode = CONTEXT_UTF8;
    ChooseContextMap(quality, &bigram_prefix_histo[0], num_literal_contexts,
                     literal_context_map);
  }
}